

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall test_app::test_mapping(test_app *this)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string *param;
  long in_RDI;
  ostringstream oss_26;
  ostringstream oss_25;
  ostringstream oss_24;
  ostringstream oss_23;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  char *in_stack_ffffffffffffc528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc530;
  string *in_stack_ffffffffffffc6c8;
  application *in_stack_ffffffffffffc6d0;
  allocator *a;
  test_app *in_stack_ffffffffffffc6d8;
  string local_3388 [32];
  ostringstream local_3368 [383];
  allocator local_31e9;
  string local_31e8 [32];
  string local_31c8 [39];
  undefined1 local_31a1;
  string local_31a0 [32];
  ostringstream local_3180 [383];
  allocator local_3001;
  string local_3000 [32];
  string local_2fe0 [39];
  undefined1 local_2fb9;
  string local_2fb8 [32];
  ostringstream local_2f98 [383];
  allocator local_2e19;
  string local_2e18 [32];
  string local_2df8 [39];
  undefined1 local_2dd1;
  string local_2dd0 [32];
  ostringstream local_2db0 [383];
  allocator local_2c31;
  string local_2c30 [32];
  string local_2c10 [39];
  undefined1 local_2be9;
  string local_2be8 [32];
  ostringstream local_2bc8 [383];
  allocator local_2a49;
  string local_2a48 [32];
  string local_2a28 [39];
  undefined1 local_2a01;
  string local_2a00 [32];
  ostringstream local_29e0 [383];
  allocator local_2861;
  string local_2860 [32];
  string local_2840 [39];
  undefined1 local_2819;
  string local_2818 [32];
  ostringstream local_27f8 [383];
  allocator local_2679;
  string local_2678 [32];
  string local_2658 [39];
  undefined1 local_2631;
  string local_2630 [32];
  ostringstream local_2610 [383];
  allocator local_2491;
  string local_2490 [32];
  string local_2470 [39];
  undefined1 local_2449;
  string local_2448 [32];
  ostringstream local_2428 [383];
  allocator local_22a9;
  string local_22a8 [32];
  string local_2288 [39];
  undefined1 local_2261;
  string local_2260 [32];
  ostringstream local_2240 [383];
  allocator local_20c1;
  string local_20c0 [32];
  string local_20a0 [39];
  undefined1 local_2079;
  string local_2078 [32];
  ostringstream local_2058 [383];
  allocator local_1ed9;
  string local_1ed8 [32];
  string local_1eb8 [39];
  undefined1 local_1e91;
  string local_1e90 [32];
  ostringstream local_1e70 [383];
  allocator local_1cf1;
  string local_1cf0 [32];
  string local_1cd0 [39];
  undefined1 local_1ca9;
  string local_1ca8 [32];
  ostringstream local_1c88 [383];
  allocator local_1b09;
  string local_1b08 [32];
  string local_1ae8 [39];
  undefined1 local_1ac1;
  string local_1ac0 [32];
  ostringstream local_1aa0 [383];
  allocator local_1921;
  string local_1920 [32];
  string local_1900 [39];
  undefined1 local_18d9;
  string local_18d8 [32];
  ostringstream local_18b8 [383];
  allocator local_1739;
  string local_1738 [32];
  string local_1718 [39];
  undefined1 local_16f1;
  string local_16f0 [32];
  ostringstream local_16d0 [383];
  allocator local_1551;
  string local_1550 [32];
  string local_1530 [39];
  undefined1 local_1509;
  string local_1508 [32];
  ostringstream local_14e8 [383];
  allocator local_1369;
  string local_1368 [32];
  string local_1348 [39];
  undefined1 local_1321;
  string local_1320 [32];
  ostringstream local_1300 [383];
  allocator local_1181;
  string local_1180 [32];
  string local_1160 [39];
  undefined1 local_1139;
  string local_1138 [32];
  ostringstream local_1118 [383];
  allocator local_f99;
  string local_f98 [32];
  string local_f78 [39];
  undefined1 local_f51;
  string local_f50 [32];
  ostringstream local_f30 [383];
  allocator local_db1;
  string local_db0 [32];
  string local_d90 [39];
  undefined1 local_d69;
  string local_d68 [32];
  ostringstream local_d48 [383];
  allocator local_bc9;
  string local_bc8 [32];
  string local_ba8 [39];
  undefined1 local_b81;
  string local_b80 [32];
  ostringstream local_b60 [383];
  allocator local_9e1;
  string local_9e0 [32];
  string local_9c0 [39];
  undefined1 local_999;
  string local_998 [32];
  ostringstream local_978 [383];
  allocator local_7f9;
  string local_7f8 [32];
  string local_7d8 [39];
  undefined1 local_7b1;
  string local_7b0 [32];
  ostringstream local_790 [383];
  allocator local_611;
  string local_610 [32];
  string local_5f0 [39];
  undefined1 local_5c9;
  string local_5c8 [32];
  ostringstream local_5a8 [383];
  allocator local_429;
  string local_428 [32];
  string local_408 [39];
  undefined1 local_3e1;
  string local_3e0 [32];
  ostringstream local_3c0 [383];
  allocator local_241;
  string local_240 [32];
  string local_220 [39];
  undefined1 local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"/somepath",&local_49);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar2 = std::operator<<((ostream *)local_1d8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x217);
    std::operator<<(poVar2," u(*this,\"/somepath\")==\"xx/test\"");
    local_1f9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1f8);
    local_1f9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"/foo/somepath",&local_241);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3c0);
    poVar2 = std::operator<<((ostream *)local_3c0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x218);
    std::operator<<(poVar2," u(*this,\"/foo/somepath\")==\"xx/foo/\"");
    local_3e1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_3e0);
    local_3e1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"/foo/",&local_429);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_5a8);
    poVar2 = std::operator<<((ostream *)local_5a8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x219);
    std::operator<<(poVar2," u(*this,\"/foo/\")==\"xx/foo/default\"");
    local_5c9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_5c8);
    local_5c9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"/foo",&local_611);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_5f0);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_790);
    poVar2 = std::operator<<((ostream *)local_790,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21a);
    std::operator<<(poVar2," u(*this,\"/foo\")==\"xx/foo/default\"");
    local_7b1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_7b0);
    local_7b1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"/foobar/bee/",&local_7f9);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_978);
    poVar2 = std::operator<<((ostream *)local_978,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21b);
    std::operator<<(poVar2," u(*this,\"/foobar/bee/\")==\"xx/foobar/bee/default\"");
    local_999 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_998);
    local_999 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"/foobar/bee",&local_9e1);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_b60);
    poVar2 = std::operator<<((ostream *)local_b60,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21c);
    std::operator<<(poVar2," u(*this,\"/foobar/bee\")==\"xx/foobar/bee/default\"");
    local_b81 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_b80);
    local_b81 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"/foobar/bee/bylang",&local_bc9);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_ba8);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_d48);
    poVar2 = std::operator<<((ostream *)local_d48,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21d);
    std::operator<<(poVar2," u(*this,\"/foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    local_d69 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_d68);
    local_d69 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_db0,"somepath",&local_db1);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_d90);
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_f30);
    poVar2 = std::operator<<((ostream *)local_f30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21f);
    std::operator<<(poVar2," u(*this,\"somepath\")==\"xx/test\"");
    local_f51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_f50);
    local_f51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f98,"foo/somepath",&local_f99);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_f78);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1118);
    poVar2 = std::operator<<((ostream *)local_1118,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x220);
    std::operator<<(poVar2," u(*this,\"foo/somepath\")==\"xx/foo/\"");
    local_1139 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1138);
    local_1139 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1180,"foobar/bee/somepath",&local_1181);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1160);
  std::__cxx11::string::~string(local_1180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1181);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1300);
    poVar2 = std::operator<<((ostream *)local_1300,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x221);
    std::operator<<(poVar2," u(*this,\"foobar/bee/somepath\")==\"xx/foobar/bee/\"");
    local_1321 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1320);
    local_1321 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1368,"foobar/bee/bylang",&local_1369);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1348);
  std::__cxx11::string::~string(local_1368);
  std::allocator<char>::~allocator((allocator<char> *)&local_1369);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_14e8);
    poVar2 = std::operator<<((ostream *)local_14e8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x222);
    std::operator<<(poVar2," u(*this,\"foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    local_1509 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1508);
    local_1509 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1550,"/somepath",&local_1551);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1530);
  std::__cxx11::string::~string(local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_16d0);
    poVar2 = std::operator<<((ostream *)local_16d0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x224);
    std::operator<<(poVar2," u(bar,\"/somepath\")==\"xx/test\"");
    local_16f1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_16f0);
    local_16f1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1738,"/foo/somepath",&local_1739);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1718);
  std::__cxx11::string::~string(local_1738);
  std::allocator<char>::~allocator((allocator<char> *)&local_1739);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_18b8);
    poVar2 = std::operator<<((ostream *)local_18b8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x225);
    std::operator<<(poVar2," u(bar,\"/foo/somepath\")==\"xx/foo/\"");
    local_18d9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_18d8);
    local_18d9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1920,"/foobar/bee/somepath",&local_1921);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1900);
  std::__cxx11::string::~string(local_1920);
  std::allocator<char>::~allocator((allocator<char> *)&local_1921);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1aa0);
    poVar2 = std::operator<<((ostream *)local_1aa0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x226);
    std::operator<<(poVar2," u(bar,\"/foobar/bee/somepath\")==\"xx/foobar/bee/\"");
    local_1ac1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1ac0);
    local_1ac1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b08,"/foobar/bee/",&local_1b09);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1ae8);
  std::__cxx11::string::~string(local_1b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b09);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c88);
    poVar2 = std::operator<<((ostream *)local_1c88,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x227);
    std::operator<<(poVar2," u(bar,\"/foobar/bee/\")==\"xx/foobar/bee/default\"");
    local_1ca9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1ca8);
    local_1ca9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cf0,"/foobar/bee",&local_1cf1);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1cd0);
  std::__cxx11::string::~string(local_1cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cf1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e70);
    poVar2 = std::operator<<((ostream *)local_1e70,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x228);
    std::operator<<(poVar2," u(bar,\"/foobar/bee\")==\"xx/foobar/bee/default\"");
    local_1e91 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1e90);
    local_1e91 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ed8,"/foobar/bee/bylang",&local_1ed9);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_1eb8);
  std::__cxx11::string::~string(local_1ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2058);
    poVar2 = std::operator<<((ostream *)local_2058,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x229);
    std::operator<<(poVar2," u(bar,\"/foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    local_2079 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2078);
    local_2079 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20c0,"/somepath",&local_20c1);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_20a0);
  std::__cxx11::string::~string(local_20c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20c1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2240);
    poVar2 = std::operator<<((ostream *)local_2240,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22b);
    std::operator<<(poVar2," u(bee.bee,\"/somepath\")==\"xx/test\"");
    local_2261 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2260);
    local_2261 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22a8,"/foo/somepath",&local_22a9);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2288);
  std::__cxx11::string::~string(local_22a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2428);
    poVar2 = std::operator<<((ostream *)local_2428,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22c);
    std::operator<<(poVar2," u(bee.bee,\"/foo/somepath\")==\"xx/foo/\"");
    local_2449 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2448);
    local_2449 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2490,"/foobar/bee/somepath",&local_2491);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2470);
  std::__cxx11::string::~string(local_2490);
  std::allocator<char>::~allocator((allocator<char> *)&local_2491);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2610);
    poVar2 = std::operator<<((ostream *)local_2610,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22d);
    std::operator<<(poVar2," u(bee.bee,\"/foobar/bee/somepath\")==\"xx/foobar/bee/\"");
    local_2631 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2630);
    local_2631 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2678,"/foobar/bee/bylang",&local_2679);
  u(in_stack_ffffffffffffc6d8,in_stack_ffffffffffffc6d0,in_stack_ffffffffffffc6c8);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2658);
  std::__cxx11::string::~string(local_2678);
  std::allocator<char>::~allocator((allocator<char> *)&local_2679);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_27f8);
    poVar2 = std::operator<<((ostream *)local_27f8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x22e);
    std::operator<<(poVar2," u(bee.bee,\"/foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    local_2819 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2818);
    local_2819 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  param = (string *)(in_RDI + 0xa0);
  a = &local_2861;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2860,"somepath",a);
  u(in_stack_ffffffffffffc6d8,(application *)a,param);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2840);
  std::__cxx11::string::~string(local_2860);
  std::allocator<char>::~allocator((allocator<char> *)&local_2861);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_29e0);
    poVar2 = std::operator<<((ostream *)local_29e0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x230);
    std::operator<<(poVar2," u(bee.bee,\"somepath\")==\"xx/foobar/bee/\"");
    local_2a01 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2a00);
    local_2a01 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a48,"bylang",&local_2a49);
  u(in_stack_ffffffffffffc6d8,(application *)a,param);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2a28);
  std::__cxx11::string::~string(local_2a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a49);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2bc8);
    poVar2 = std::operator<<((ostream *)local_2bc8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x231);
    std::operator<<(poVar2," u(bee.bee,\"bylang\")==\"xx/foobar/bee/en\"");
    local_2be9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2be8);
    local_2be9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c30,"../somepath",&local_2c31);
  u(in_stack_ffffffffffffc6d8,(application *)a,param);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2c10);
  std::__cxx11::string::~string(local_2c30);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c31);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2db0);
    poVar2 = std::operator<<((ostream *)local_2db0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x233);
    std::operator<<(poVar2," u(bee.bee,\"../somepath\")==\"xx/foobar/\"");
    local_2dd1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2dd0);
    local_2dd1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e18,"../../somepath",&local_2e19);
  u(in_stack_ffffffffffffc6d8,(application *)a,param);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2df8);
  std::__cxx11::string::~string(local_2e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e19);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2f98);
    poVar2 = std::operator<<((ostream *)local_2f98,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x234);
    std::operator<<(poVar2," u(bee.bee,\"../../somepath\")==\"xx/test\"");
    local_2fb9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2fb8);
    local_2fb9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3000,"bylang",&local_3001);
  u(in_stack_ffffffffffffc6d8,(application *)a,param);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_2fe0);
  std::__cxx11::string::~string(local_3000);
  std::allocator<char>::~allocator((allocator<char> *)&local_3001);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3180);
    poVar2 = std::operator<<((ostream *)local_3180,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x235);
    std::operator<<(poVar2," u(bee.bee,\"bylang\")==\"xx/foobar/bee/en\"");
    local_31a1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_31a0);
    local_31a1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_31e8,"../foobar/bee/bylang",&local_31e9);
  u(in_stack_ffffffffffffc6d8,(application *)a,param);
  bVar1 = std::operator==(in_stack_ffffffffffffc530,in_stack_ffffffffffffc528);
  std::__cxx11::string::~string(local_31c8);
  std::__cxx11::string::~string(local_31e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_31e9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3368);
    poVar2 = std::operator<<((ostream *)local_3368,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x236);
    std::operator<<(poVar2," u(foo,\"../foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_3388);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void test_mapping()
	{
		TEST(u(*this,"/somepath")=="xx/test");
		TEST(u(*this,"/foo/somepath")=="xx/foo/");
		TEST(u(*this,"/foo/")=="xx/foo/default");
		TEST(u(*this,"/foo")=="xx/foo/default");
		TEST(u(*this,"/foobar/bee/")=="xx/foobar/bee/default");
		TEST(u(*this,"/foobar/bee")=="xx/foobar/bee/default");
		TEST(u(*this,"/foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(*this,"somepath")=="xx/test");
		TEST(u(*this,"foo/somepath")=="xx/foo/");
		TEST(u(*this,"foobar/bee/somepath")=="xx/foobar/bee/");
		TEST(u(*this,"foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(bar,"/somepath")=="xx/test");
		TEST(u(bar,"/foo/somepath")=="xx/foo/");
		TEST(u(bar,"/foobar/bee/somepath")=="xx/foobar/bee/");
		TEST(u(bar,"/foobar/bee/")=="xx/foobar/bee/default");
		TEST(u(bar,"/foobar/bee")=="xx/foobar/bee/default");
		TEST(u(bar,"/foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(bee.bee,"/somepath")=="xx/test");
		TEST(u(bee.bee,"/foo/somepath")=="xx/foo/");
		TEST(u(bee.bee,"/foobar/bee/somepath")=="xx/foobar/bee/");
		TEST(u(bee.bee,"/foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(bee.bee,"somepath")=="xx/foobar/bee/");
		TEST(u(bee.bee,"bylang")=="xx/foobar/bee/en");
		
		TEST(u(bee.bee,"../somepath")=="xx/foobar/");
		TEST(u(bee.bee,"../../somepath")=="xx/test");
		TEST(u(bee.bee,"bylang")=="xx/foobar/bee/en");
		TEST(u(foo,"../foobar/bee/bylang")=="xx/foobar/bee/en");
	}